

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test::TestBody
          (ResizeRealtimeTest_TestInternalResizeSetScaleMode3_Test *this)

{
  bool bVar1;
  ResizeRealtimeTest *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint expected_h;
  uint expected_w;
  uint frame;
  FrameInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range1;
  AssertionResult gtest_ar;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  Y4mVideoSource video;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *in_stack_fffffffffffffd88;
  Y4mVideoSource *in_stack_fffffffffffffd90;
  Message *in_stack_fffffffffffffd98;
  Message *in_stack_fffffffffffffda0;
  Message *in_stack_fffffffffffffda8;
  int line;
  char *in_stack_fffffffffffffdb0;
  string *in_stack_fffffffffffffdb8;
  Type type;
  Y4mVideoSource *in_stack_fffffffffffffdc0;
  Message *in_stack_fffffffffffffe08;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffe10;
  AssertionResult local_1d8 [2];
  AssertionResult local_1b8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  uint local_19c;
  reference local_198;
  FrameInfo *local_190;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_188;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *local_180;
  uint local_164;
  size_type local_160;
  AssertionResult local_158 [2];
  uint local_134;
  HasNewFatalFailureHelper local_130;
  allocator local_101;
  string local_100 [32];
  Y4mVideoSource local_e0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_100,"niklas_1280_720_30.y4m",&local_101);
  libaom_test::Y4mVideoSource::Y4mVideoSource
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (uint)((ulong)in_stack_fffffffffffffdb0 >> 0x20),(int)in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator((allocator<char> *)&local_101);
  (in_RDI->super_EncoderTest).cfg_.g_w = 0x500;
  (in_RDI->super_EncoderTest).cfg_.g_h = 0x2d0;
  in_RDI->set_scale_mode_ = false;
  in_RDI->set_scale_mode2_ = false;
  in_RDI->set_scale_mode3_ = true;
  ResizeRealtimeTest::DefaultConfig(in_RDI);
  in_RDI->change_bitrate_ = false;
  in_RDI->mismatch_nframes_ = 0;
  bVar1 = testing::internal::AlwaysTrue();
  type = (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffdc0);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,&local_e0);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_130);
    if (bVar1) {
      local_134 = 2;
    }
    else {
      local_134 = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)in_stack_fffffffffffffd90);
    type = (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    if (local_134 == 0) {
      local_160 = std::
                  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ::size(&in_RDI->frame_info_list_);
      local_164 = libaom_test::Y4mVideoSource::limit(&local_e0);
      testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
                ((char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                 (unsigned_long *)in_stack_fffffffffffffd98,(uint *)in_stack_fffffffffffffd90);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_158);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
        testing::AssertionResult::failure_message((AssertionResult *)0x8def7e);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffdc0,
                   (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0,
                   (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),(char *)in_stack_fffffffffffffda0
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,in_stack_fffffffffffffe08)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
        testing::Message::~Message((Message *)0x8defdb);
      }
      local_134 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8df062);
      if (local_134 == 0) {
        local_180 = &in_RDI->frame_info_list_;
        local_188._M_current =
             (FrameInfo *)
             std::
             vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
             ::begin(in_stack_fffffffffffffd88);
        local_190 = (FrameInfo *)
                    std::
                    vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    ::end(in_stack_fffffffffffffd88);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                   *)in_stack_fffffffffffffd90,
                                  (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                                   *)in_stack_fffffffffffffd88), bVar1) {
          local_198 = __gnu_cxx::
                      __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                      ::operator*(&local_188);
          local_19c = (uint)local_198->pts;
          local_1a0 = 0x280;
          if (0x1e < local_19c) {
            local_1a0 = 0x500;
          }
          local_1a4 = 0x2d0;
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                     (uint *)in_stack_fffffffffffffd98,(uint *)in_stack_fffffffffffffd90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
            testing::Message::operator<<
                      ((Message *)in_stack_fffffffffffffd90,(char (*) [7])in_stack_fffffffffffffd88)
            ;
            in_stack_fffffffffffffdc0 =
                 (Y4mVideoSource *)
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd90,(uint *)in_stack_fffffffffffffd88);
            in_stack_fffffffffffffdb8 =
                 (string *)
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd90,
                            (char (*) [22])in_stack_fffffffffffffd88);
            in_stack_fffffffffffffdb0 =
                 testing::AssertionResult::failure_message((AssertionResult *)0x8df1f0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0,
                       (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0,
                       (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (char *)in_stack_fffffffffffffda0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,
                       in_stack_fffffffffffffe08);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd90);
            testing::Message::~Message((Message *)0x8df24a);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x8df2b8);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                     (uint *)in_stack_fffffffffffffd98,(uint *)in_stack_fffffffffffffd90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1d8);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffda8 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd90,
                            (char (*) [7])in_stack_fffffffffffffd88);
            in_stack_fffffffffffffda0 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd90,(uint *)in_stack_fffffffffffffd88);
            in_stack_fffffffffffffd98 =
                 testing::Message::operator<<
                           ((Message *)in_stack_fffffffffffffd90,
                            (char (*) [23])in_stack_fffffffffffffd88);
            in_stack_fffffffffffffd90 =
                 (Y4mVideoSource *)
                 testing::AssertionResult::failure_message((AssertionResult *)0x8df37b);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0,
                       (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0,
                       (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (char *)in_stack_fffffffffffffda0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,
                       in_stack_fffffffffffffe08);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd90);
            testing::Message::~Message((Message *)0x8df3d5);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x8df443);
          ResizeRealtimeTest::GetMismatchFrames(in_RDI);
          testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                    ((char *)in_stack_fffffffffffffda8,(char *)in_stack_fffffffffffffda0,
                     (uint *)in_stack_fffffffffffffd98,(uint *)in_stack_fffffffffffffd90);
          bVar1 = testing::AssertionResult::operator_cast_to_bool
                            ((AssertionResult *)&stack0xfffffffffffffe08);
          if (!bVar1) {
            testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
            in_stack_fffffffffffffd88 =
                 (vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  *)testing::AssertionResult::failure_message((AssertionResult *)0x8df4c3);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffdc0,
                       (Type)((ulong)in_stack_fffffffffffffdb8 >> 0x20),in_stack_fffffffffffffdb0,
                       (int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                       (char *)in_stack_fffffffffffffda0);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,
                       in_stack_fffffffffffffe08);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)in_stack_fffffffffffffd90);
            testing::Message::~Message((Message *)0x8df50f);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x8df574);
          __gnu_cxx::
          __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
          ::operator++(&local_188);
        }
        local_134 = 0;
      }
      goto LAB_008df5a0;
    }
    if (local_134 != 2) goto LAB_008df5a0;
  }
  line = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffdc0);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffdc0,type,in_stack_fffffffffffffdb0,line,
             (char *)in_stack_fffffffffffffda0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffffe10._M_head_impl,in_stack_fffffffffffffe08);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd90);
  testing::Message::~Message((Message *)0x8dee97);
  local_134 = 1;
LAB_008df5a0:
  libaom_test::Y4mVideoSource::~Y4mVideoSource(in_stack_fffffffffffffd90);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeSetScaleMode3) {
  ::libaom_test::Y4mVideoSource video("niklas_1280_720_30.y4m", 0, 60);
  cfg_.g_w = 1280;
  cfg_.g_h = 720;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = true;
  DefaultConfig();
  change_bitrate_ = false;
  mismatch_nframes_ = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());
  for (const auto &info : frame_info_list_) {
    const auto frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w = 640;
    unsigned int expected_h = 720;
    if (frame > 30) {
      expected_w = 1280;
      expected_h = 720;
    }
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
    EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
  }
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}